

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

Result __thiscall
wabt::interp::DefinedFunc::DoCall
          (DefinedFunc *this,Thread *thread,Values *params,Values *results,Ptr *out_trap)

{
  Store *store;
  RunResult RVar1;
  Enum EVar2;
  allocator<char> local_89;
  _Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> local_88;
  Ptr local_68;
  string local_50;
  
  if ((long)(params->super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>).
            _M_impl.super__Vector_impl_data._M_finish -
      (long)(params->super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>).
            _M_impl.super__Vector_impl_data._M_start >> 4 ==
      (long)(this->super_Func).type_.params.
            super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(this->super_Func).type_.params.
            super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
            super__Vector_impl_data._M_start >> 3) {
    Thread::PushValues(thread,&(this->super_Func).type_.params,params);
    RVar1 = Thread::PushCall(thread,this,out_trap);
    EVar2 = Error;
    if (RVar1 != Trap) {
      RVar1 = Thread::Run(thread,out_trap);
      if (RVar1 != Trap) {
        if (RVar1 == Exception) {
          store = thread->store_;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_50,"uncaught exception",&local_89);
          local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          Trap::New(&local_68,store,&local_50,
                    (vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *)&local_88);
          out_trap->obj_ = local_68.obj_;
          out_trap->store_ = local_68.store_;
          out_trap->root_index_ = local_68.root_index_;
          local_68.obj_ = (Trap *)0x0;
          local_68.store_ = (Store *)0x0;
          local_68.root_index_ = 0;
          RefPtr<wabt::interp::Trap>::reset(&local_68);
          std::_Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::
          ~_Vector_base(&local_88);
          std::__cxx11::string::_M_dispose();
        }
        else {
          Thread::PopValues(thread,&(this->super_Func).type_.results,results);
          EVar2 = Ok;
        }
      }
    }
    return (Result)EVar2;
  }
  __assert_fail("params.size() == type_.params.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/interp/interp.cc"
                ,0x1b6,
                "virtual Result wabt::interp::DefinedFunc::DoCall(Thread &, const Values &, Values &, Trap::Ptr *)"
               );
}

Assistant:

Result DefinedFunc::DoCall(Thread& thread,
                           const Values& params,
                           Values& results,
                           Trap::Ptr* out_trap) {
  assert(params.size() == type_.params.size());
  thread.PushValues(type_.params, params);
  RunResult result = thread.PushCall(*this, out_trap);
  if (result == RunResult::Trap) {
    return Result::Error;
  }
  result = thread.Run(out_trap);
  if (result == RunResult::Trap) {
    return Result::Error;
  } else if (result == RunResult::Exception) {
    // While this is not actually a trap, it is a convenient way
    // to report an uncaught exception.
    *out_trap = Trap::New(thread.store(), "uncaught exception");
    return Result::Error;
  }
  thread.PopValues(type_.results, &results);
  return Result::Ok;
}